

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

int fsg_model_free(fsg_model_t *fsg)

{
  int iVar1;
  hash_table_t *h;
  int iVar2;
  hash_iter_t *itor;
  long lVar3;
  
  iVar2 = 0;
  if (fsg != (fsg_model_t *)0x0) {
    iVar1 = fsg->refcount;
    iVar2 = iVar1 + -1;
    fsg->refcount = iVar2;
    if (iVar1 < 2) {
      if (0 < fsg->n_word) {
        lVar3 = 0;
        do {
          ckd_free(fsg->vocab[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < fsg->n_word);
      }
      if (0 < fsg->n_state) {
        lVar3 = 0;
        do {
          h = fsg->trans[lVar3].trans;
          if (h != (hash_table_t *)0x0) {
            for (itor = hash_table_iter(h); itor != (hash_iter_t *)0x0;
                itor = hash_table_iter_next(itor)) {
              glist_free((glist_t)itor->ent->val);
            }
          }
          hash_table_free(fsg->trans[lVar3].trans);
          hash_table_free(fsg->trans[lVar3].null_trans);
          lVar3 = lVar3 + 1;
        } while (lVar3 < fsg->n_state);
      }
      ckd_free(fsg->trans);
      ckd_free(fsg->vocab);
      listelem_alloc_free(fsg->link_alloc);
      ckd_free(fsg->silwords);
      ckd_free(fsg->altwords);
      ckd_free(fsg->name);
      ckd_free(fsg);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
fsg_model_free(fsg_model_t * fsg)
{
    int i;

    if (fsg == NULL)
        return 0;

    if (--fsg->refcount > 0)
        return fsg->refcount;

    for (i = 0; i < fsg->n_word; ++i)
        ckd_free(fsg->vocab[i]);
    for (i = 0; i < fsg->n_state; ++i)
        trans_list_free(fsg, i);
    ckd_free(fsg->trans);
    ckd_free(fsg->vocab);
    listelem_alloc_free(fsg->link_alloc);
    bitvec_free(fsg->silwords);
    bitvec_free(fsg->altwords);
    ckd_free(fsg->name);
    ckd_free(fsg);
    return 0;
}